

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

SAttribute * __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *name)

{
  long lVar1;
  bool bVar2;
  SAttribute *pSVar3;
  long lVar4;
  long lVar5;
  string<unsigned_short> n;
  
  if (name == (unsigned_short *)0x0) {
    pSVar3 = (SAttribute *)0x0;
  }
  else {
    core::string<unsigned_short>::string<unsigned_short>(&n,name);
    lVar5 = -1;
    pSVar3 = (SAttribute *)0x0;
    lVar1 = -0x20;
    do {
      lVar4 = lVar1;
      lVar5 = lVar5 + 1;
      if ((int)(this->Attributes).used <= lVar5) goto LAB_005b1895;
      bVar2 = core::string<unsigned_short>::operator==
                        ((string<unsigned_short> *)
                         ((long)&(this->Attributes).data[1].Name.array + lVar4),&n);
      lVar1 = lVar4 + 0x20;
    } while (!bVar2);
    pSVar3 = (SAttribute *)((long)&(this->Attributes).data[1].Name.array + lVar4);
LAB_005b1895:
    core::string<unsigned_short>::~string(&n);
  }
  return pSVar3;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}